

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_object.cpp
# Opt level: O0

void __thiscall Object_Nested_Test<char>::TestBody(Object_Nested_Test<char> *this)

{
  initializer_list<pstore::dump::object::member> __l;
  initializer_list<pstore::dump::object::member> __l_00;
  bool bVar1;
  char *message;
  member *__n;
  void *__buf;
  member *local_348;
  member *local_330;
  AssertHelper local_2d8;
  Message local_2d0;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> expected;
  __string_type actual;
  value_ptr local_270;
  allocator local_259;
  string local_258;
  value_ptr local_238;
  allocator local_221;
  string local_220;
  member *local_200;
  member local_1f8;
  member local_1c8;
  iterator local_198;
  size_type local_190;
  vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_> local_188;
  value_ptr local_170;
  allocator local_159;
  string local_158;
  allocator local_131;
  string local_130;
  value_ptr local_110 [2];
  allocator local_e9;
  string local_e8;
  member *local_c8;
  member local_c0;
  member local_90;
  iterator local_60;
  size_type local_58;
  vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_> local_50;
  undefined1 local_38 [8];
  object v;
  Object_Nested_Test<char> *this_local;
  
  actual.field_2._M_local_buf[0xd] = '\x01';
  local_c8 = &local_c0;
  v._32_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,"k1",&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_130,"value1",&local_131);
  pstore::dump::make_value((dump *)local_110,&local_130);
  pstore::dump::object::member::member(&local_c0,&local_e8,local_110);
  local_c8 = &local_90;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_158,"k2",&local_159);
  actual.field_2._M_local_buf[0xf] = '\x01';
  local_200 = &local_1f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_220,"ik1",&local_221);
  pstore::dump::make_value((dump *)&local_238,"iv1");
  pstore::dump::object::member::member(&local_1f8,&local_220,&local_238);
  local_200 = &local_1c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_258,"ik2",&local_259);
  pstore::dump::make_value((dump *)&local_270,"iv2");
  pstore::dump::object::member::member(&local_1c8,&local_258,&local_270);
  actual.field_2._M_local_buf[0xf] = '\0';
  local_198 = &local_1f8;
  local_190 = 2;
  std::allocator<pstore::dump::object::member>::allocator
            ((allocator<pstore::dump::object::member> *)(actual.field_2._M_local_buf + 0xe));
  __l._M_len = local_190;
  __l._M_array = local_198;
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::vector
            (&local_188,__l,
             (allocator<pstore::dump::object::member> *)(actual.field_2._M_local_buf + 0xe));
  pstore::dump::make_value((dump *)&local_170,&local_188);
  pstore::dump::object::member::member(&local_90,&local_158,&local_170);
  actual.field_2._M_local_buf[0xd] = '\0';
  local_60 = &local_c0;
  local_58 = 2;
  std::allocator<pstore::dump::object::member>::allocator
            ((allocator<pstore::dump::object::member> *)(actual.field_2._M_local_buf + 0xc));
  __l_00._M_len = local_58;
  __l_00._M_array = local_60;
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::vector
            (&local_50,__l_00,
             (allocator<pstore::dump::object::member> *)(actual.field_2._M_local_buf + 0xc));
  pstore::dump::object::object((object *)local_38,&local_50);
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::~vector
            (&local_50);
  std::allocator<pstore::dump::object::member>::~allocator
            ((allocator<pstore::dump::object::member> *)(actual.field_2._M_local_buf + 0xc));
  local_330 = (member *)&local_60;
  do {
    local_330 = local_330 + -1;
    pstore::dump::object::member::~member(local_330);
  } while (local_330 != &local_c0);
  std::shared_ptr<pstore::dump::value>::~shared_ptr(&local_170);
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::~vector
            (&local_188);
  std::allocator<pstore::dump::object::member>::~allocator
            ((allocator<pstore::dump::object::member> *)(actual.field_2._M_local_buf + 0xe));
  __n = &local_1f8;
  local_348 = (member *)&local_198;
  do {
    local_348 = local_348 + -1;
    pstore::dump::object::member::~member(local_348);
  } while (local_348 != __n);
  std::shared_ptr<pstore::dump::value>::~shared_ptr(&local_270);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  std::shared_ptr<pstore::dump::value>::~shared_ptr(&local_238);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::shared_ptr<pstore::dump::value>::~shared_ptr(local_110);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  pstore::dump::value::write((value *)local_38,(int)this + 0x10,__buf,(size_t)__n);
  std::__cxx11::ostringstream::str();
  convert<char>((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &gtest_ar.message_,"k1 : value1\nk2 : \n    ik1 : iv1\n    ik2 : iv2");
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_2c8,"expected","actual",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar.message_
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)&expected.field_2 + 8));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c8);
  if (!bVar1) {
    testing::Message::Message(&local_2d0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_2c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_2d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/dump/test_object.cpp"
               ,0x95,message);
    testing::internal::AssertHelper::operator=(&local_2d8,&local_2d0);
    testing::internal::AssertHelper::~AssertHelper(&local_2d8);
    testing::Message::~Message(&local_2d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  std::__cxx11::string::~string((string *)(expected.field_2._M_local_buf + 8));
  pstore::dump::object::~object((object *)local_38);
  return;
}

Assistant:

TYPED_TEST (Object, Nested) {
    using namespace ::pstore::dump;
    object v{{
        {"k1", make_value (std::string ("value1"))},
        {"k2", make_value (object::container{
                   {"ik1", make_value ("iv1")},
                   {"ik2", make_value ("iv2")},
               })},
    }};
    v.write (this->out);
    auto const actual = this->out.str ();
    auto const expected = convert<TypeParam> ("k1 : value1\n"
                                              "k2 : \n"
                                              "    ik1 : iv1\n"
                                              "    ik2 : iv2");
    EXPECT_EQ (expected, actual);
}